

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

void Extra_NpnTest2(void)

{
  word local_28;
  word t;
  word tMin;
  int *pPerm;
  int *pComp;
  
  local_28 = 0xa2222aaa08888000;
  pPerm = Extra_GreyCodeSchedule(6);
  tMin = (word)Extra_PermSchedule(6);
  t = Extra_Truth6MinimumExact(local_28,pPerm,(int *)tMin);
  if (tMin != 0) {
    free((void *)tMin);
    tMin = 0;
  }
  if (pPerm != (int *)0x0) {
    free(pPerm);
    pPerm = (int *)0x0;
  }
  Extra_PrintHex(_stdout,(uint *)&local_28,6);
  printf("\n");
  Extra_PrintHex(_stdout,(uint *)&t,6);
  printf("\n");
  return;
}

Assistant:

void Extra_NpnTest2()
{
    int * pComp, * pPerm;
    word tMin, t = ABC_CONST(0xa2222aaa08888000);
    pComp = Extra_GreyCodeSchedule( 6 );
    pPerm = Extra_PermSchedule( 6 );
    tMin  = Extra_Truth6MinimumExact( t, pComp, pPerm );
    ABC_FREE( pPerm );
    ABC_FREE( pComp );

    Extra_PrintHex( stdout, (unsigned *)&t,    6 ), printf( "\n" );
    Extra_PrintHex( stdout, (unsigned *)&tMin, 6 ), printf( "\n" );
}